

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

string * __thiscall cppcms::rpc::json_rpc_server::method_abi_cxx11_(json_rpc_server *this)

{
  json_call *in_RSI;
  string *in_RDI;
  json_rpc_server *in_stack_00000020;
  
  check_call(in_stack_00000020);
  std::__shared_ptr_access<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x44ce16);
  json_call::method_abi_cxx11_(in_RSI);
  return in_RDI;
}

Assistant:

std::string json_rpc_server::method()
	{
		check_call();
		return current_call_->method();
	}